

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O2

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::doAddCols(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *set,bool scale)

{
  undefined8 *puVar1;
  uint *puVar2;
  int iVar3;
  int p_size;
  int iVar4;
  pointer pnVar5;
  pointer pnVar6;
  Item *pIVar7;
  type_conflict5 tVar8;
  uint uVar9;
  long lVar10;
  int *piVar11;
  double *pdVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  Item *pIVar17;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar18;
  cpp_dec_float<100U,_int,_void> *result;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar19;
  ulong uVar20;
  DataArray<int> newRows;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  empty;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined4 local_138;
  undefined1 local_134;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  int local_e8;
  undefined1 local_e4;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  int local_98;
  undefined1 local_94;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  int local_48;
  undefined1 local_44;
  undefined8 local_40;
  
  iVar3 = (this->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  lVar10 = (long)iVar3;
  p_size = (this->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
  DataArray<int>::DataArray(&newRows,p_size,0,1.2);
  if (&this->
       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      != set) {
    LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::add(&this->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ,set);
  }
  for (uVar13 = (ulong)(uint)(this->
                             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).
                             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .set.thenum; 0 < (int)uVar13; uVar13 = uVar13 - 1) {
    newRows.data[uVar13 - 1] = 0;
  }
  uVar13 = (ulong)(uint)(set->
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).set.thenum;
  piVar11 = newRows.data;
  while (0 < (int)uVar13) {
    uVar13 = uVar13 - 1;
    pIVar17 = (set->
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).set.theitem;
    iVar15 = (set->
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).set.thekey[uVar13].idx;
    uVar20 = (ulong)(uint)pIVar17[iVar15].data.
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused;
    while (0 < (int)uVar20) {
      iVar4 = pIVar17[iVar15].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .m_elem[uVar20 - 1].idx;
      if ((this->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum <= iVar4) {
        LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::LPRowBase(&empty,0);
        DataArray<int>::reSize(&newRows,iVar4 + 1);
        for (lVar16 = (long)(this->
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .set.thenum; lVar16 <= iVar4; lVar16 = lVar16 + 1) {
          newRows.data[lVar16] = 0;
          LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add(&this->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ,&empty);
        }
        DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::~DSVectorBase(&empty.vec);
        piVar11 = newRows.data;
      }
      piVar11[iVar4] = piVar11[iVar4] + 1;
      uVar20 = uVar20 - 1;
    }
  }
  for (lVar16 = 0;
      lVar16 < (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum; lVar16 = lVar16 + 1) {
    if (0 < newRows.data[lVar16]) {
      iVar15 = newRows.data[lVar16] +
               (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.theitem
               [(this->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thekey[lVar16].idx].data.
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .memused;
      LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::xtend(&this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,(int)lVar16,iVar15);
      (this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .set.theitem
      [(this->
       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .set.thekey[lVar16].idx].data.
      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .memused = iVar15;
    }
  }
  for (; iVar15 = (this->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thenum, lVar10 < iVar15; lVar10 = lVar10 + 1) {
    result = &(this->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).object.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar10].m_backend;
    if (this->thesense == MAXIMIZE) {
      boost::multiprecision::backends::eval_multiply<100u,int,void>(result,1);
    }
    else {
      boost::multiprecision::backends::eval_multiply<100u,int,void>(result,-1);
    }
    pIVar17 = (this->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem +
              (this->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[lVar10].idx;
    uVar9 = 0;
    if (scale) {
      uVar9 = (*this->lp_scaler->_vptr_SPxScaler[1])
                        (this->lp_scaler,pIVar17,
                         &(this->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).scaleExp);
      pnVar5 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar12 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<100U,_int,_void> *)&empty,*pdVar12,(type *)0x0);
      tVar8 = boost::multiprecision::operator<(pnVar5 + lVar10,&empty.left);
      if (tVar8) {
        pnVar5 = (this->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).up.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_88 = *(undefined8 *)&pnVar5[lVar10].m_backend.data;
        uStack_80 = *(undefined8 *)(pnVar5[lVar10].m_backend.data._M_elems + 2);
        puVar2 = pnVar5[lVar10].m_backend.data._M_elems + 4;
        local_78 = *(undefined8 *)puVar2;
        uStack_70 = *(undefined8 *)(puVar2 + 2);
        puVar2 = pnVar5[lVar10].m_backend.data._M_elems + 8;
        local_68 = *(undefined8 *)puVar2;
        uStack_60 = *(undefined8 *)(puVar2 + 2);
        puVar2 = pnVar5[lVar10].m_backend.data._M_elems + 0xc;
        local_58 = *(undefined8 *)puVar2;
        uStack_50 = *(undefined8 *)(puVar2 + 2);
        local_48 = pnVar5[lVar10].m_backend.exp;
        local_44 = pnVar5[lVar10].m_backend.neg;
        local_40._0_4_ = pnVar5[lVar10].m_backend.fpclass;
        local_40._4_4_ = pnVar5[lVar10].m_backend.prec_elem;
        spxLdexp<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
                  ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                    *)&empty,(soplex *)&local_88,
                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)(ulong)-uVar9,CONCAT31((int3)((uint)local_48 >> 8),local_44));
        pnVar6 = (this->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).up.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar2 = pnVar6[lVar10].m_backend.data._M_elems + 0xc;
        *(undefined8 *)puVar2 = empty.left.m_backend.data._M_elems._48_8_;
        *(undefined8 *)(puVar2 + 2) = empty.left.m_backend.data._M_elems._56_8_;
        puVar2 = pnVar6[lVar10].m_backend.data._M_elems + 8;
        *(undefined8 *)puVar2 = empty.left.m_backend.data._M_elems._32_8_;
        *(undefined8 *)(puVar2 + 2) = empty.left.m_backend.data._M_elems._40_8_;
        puVar2 = pnVar6[lVar10].m_backend.data._M_elems + 4;
        *(undefined8 *)puVar2 = empty.left.m_backend.data._M_elems._16_8_;
        *(undefined8 *)(puVar2 + 2) = empty.left.m_backend.data._M_elems._24_8_;
        pnVar5 = pnVar6 + lVar10;
        (pnVar5->m_backend).data._M_elems[0] = empty.left.m_backend.data._M_elems[0];
        (pnVar5->m_backend).data._M_elems[1] = empty.left.m_backend.data._M_elems[1];
        (pnVar5->m_backend).data._M_elems[2] = empty.left.m_backend.data._M_elems[2];
        (pnVar5->m_backend).data._M_elems[3] = empty.left.m_backend.data._M_elems[3];
        pnVar6[lVar10].m_backend.exp = empty.left.m_backend.exp;
        pnVar6[lVar10].m_backend.neg = empty.left.m_backend.neg;
        pnVar6[lVar10].m_backend.fpclass = empty.left.m_backend.fpclass;
        pnVar6[lVar10].m_backend.prec_elem = empty.left.m_backend.prec_elem;
      }
      pnVar5 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar12 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<100U,_int,_void> *)&empty,-*pdVar12,(type *)0x0);
      tVar8 = boost::multiprecision::operator>(pnVar5 + lVar10,&empty.left);
      if (tVar8) {
        pnVar5 = (this->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_d8 = *(undefined8 *)&pnVar5[lVar10].m_backend.data;
        uStack_d0 = *(undefined8 *)(pnVar5[lVar10].m_backend.data._M_elems + 2);
        puVar2 = pnVar5[lVar10].m_backend.data._M_elems + 4;
        local_c8 = *(undefined8 *)puVar2;
        uStack_c0 = *(undefined8 *)(puVar2 + 2);
        puVar2 = pnVar5[lVar10].m_backend.data._M_elems + 8;
        local_b8 = *(undefined8 *)puVar2;
        uStack_b0 = *(undefined8 *)(puVar2 + 2);
        puVar2 = pnVar5[lVar10].m_backend.data._M_elems + 0xc;
        local_a8 = *(undefined8 *)puVar2;
        uStack_a0 = *(undefined8 *)(puVar2 + 2);
        local_98 = pnVar5[lVar10].m_backend.exp;
        local_94 = pnVar5[lVar10].m_backend.neg;
        local_90._0_4_ = pnVar5[lVar10].m_backend.fpclass;
        local_90._4_4_ = pnVar5[lVar10].m_backend.prec_elem;
        spxLdexp<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
                  ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                    *)&empty,(soplex *)&local_d8,
                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)(ulong)-uVar9,CONCAT31((int3)((uint)local_98 >> 8),local_94));
        pnVar5 = (this->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar2 = pnVar5[lVar10].m_backend.data._M_elems + 0xc;
        *(undefined8 *)puVar2 = empty.left.m_backend.data._M_elems._48_8_;
        *(undefined8 *)(puVar2 + 2) = empty.left.m_backend.data._M_elems._56_8_;
        puVar2 = pnVar5[lVar10].m_backend.data._M_elems + 8;
        *(undefined8 *)puVar2 = empty.left.m_backend.data._M_elems._32_8_;
        *(undefined8 *)(puVar2 + 2) = empty.left.m_backend.data._M_elems._40_8_;
        puVar2 = pnVar5[lVar10].m_backend.data._M_elems + 4;
        *(undefined8 *)puVar2 = empty.left.m_backend.data._M_elems._16_8_;
        *(undefined8 *)(puVar2 + 2) = empty.left.m_backend.data._M_elems._24_8_;
        *(ulong *)&pnVar5[lVar10].m_backend.data =
             CONCAT44(empty.left.m_backend.data._M_elems[1],empty.left.m_backend.data._M_elems[0]);
        *(ulong *)(pnVar5[lVar10].m_backend.data._M_elems + 2) =
             CONCAT44(empty.left.m_backend.data._M_elems[3],empty.left.m_backend.data._M_elems[2]);
        pnVar5[lVar10].m_backend.exp = empty.left.m_backend.exp;
        pnVar5[lVar10].m_backend.neg = empty.left.m_backend.neg;
        pnVar5[lVar10].m_backend.fpclass = empty.left.m_backend.fpclass;
        pnVar5[lVar10].m_backend.prec_elem = empty.left.m_backend.prec_elem;
      }
      pnVar5 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_128 = *(undefined8 *)&pnVar5[lVar10].m_backend.data;
      uStack_120 = *(undefined8 *)(pnVar5[lVar10].m_backend.data._M_elems + 2);
      puVar2 = pnVar5[lVar10].m_backend.data._M_elems + 4;
      local_118 = *(undefined8 *)puVar2;
      uStack_110 = *(undefined8 *)(puVar2 + 2);
      puVar2 = pnVar5[lVar10].m_backend.data._M_elems + 8;
      local_108 = *(undefined8 *)puVar2;
      uStack_100 = *(undefined8 *)(puVar2 + 2);
      puVar2 = pnVar5[lVar10].m_backend.data._M_elems + 0xc;
      local_f8 = *(undefined8 *)puVar2;
      uStack_f0 = *(undefined8 *)(puVar2 + 2);
      local_e8 = pnVar5[lVar10].m_backend.exp;
      local_e4 = pnVar5[lVar10].m_backend.neg;
      local_e0._0_4_ = pnVar5[lVar10].m_backend.fpclass;
      local_e0._4_4_ = pnVar5[lVar10].m_backend.prec_elem;
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)&empty,(soplex *)&local_128,
                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)uVar9,CONCAT31((int3)((uint)local_e8 >> 8),local_e4));
      pnVar5 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar2 = pnVar5[lVar10].m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar2 = empty.left.m_backend.data._M_elems._48_8_;
      *(undefined8 *)(puVar2 + 2) = empty.left.m_backend.data._M_elems._56_8_;
      puVar2 = pnVar5[lVar10].m_backend.data._M_elems + 8;
      *(undefined8 *)puVar2 = empty.left.m_backend.data._M_elems._32_8_;
      *(undefined8 *)(puVar2 + 2) = empty.left.m_backend.data._M_elems._40_8_;
      puVar2 = pnVar5[lVar10].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = empty.left.m_backend.data._M_elems._16_8_;
      *(undefined8 *)(puVar2 + 2) = empty.left.m_backend.data._M_elems._24_8_;
      *(ulong *)&pnVar5[lVar10].m_backend.data =
           CONCAT44(empty.left.m_backend.data._M_elems[1],empty.left.m_backend.data._M_elems[0]);
      *(ulong *)(pnVar5[lVar10].m_backend.data._M_elems + 2) =
           CONCAT44(empty.left.m_backend.data._M_elems[3],empty.left.m_backend.data._M_elems[2]);
      pnVar5[lVar10].m_backend.exp = empty.left.m_backend.exp;
      pnVar5[lVar10].m_backend.neg = empty.left.m_backend.neg;
      pnVar5[lVar10].m_backend.fpclass = empty.left.m_backend.fpclass;
      pnVar5[lVar10].m_backend.prec_elem = empty.left.m_backend.prec_elem;
      (this->
      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).scaleExp.data[lVar10] = uVar9;
    }
    uVar13 = (ulong)(uint)(pIVar17->data).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused;
    lVar16 = uVar13 * 0x54;
    while( true ) {
      if ((int)uVar13 < 1) break;
      pNVar18 = (pIVar17->data).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .m_elem;
      iVar15 = *(int *)((long)(&pNVar18[-1].val + 1) + lVar16);
      pIVar7 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.theitem;
      iVar4 = (this->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[iVar15].idx;
      lVar14 = (long)pIVar7[iVar4].data.
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused - (long)newRows.data[iVar15];
      newRows.data[iVar15] = newRows.data[iVar15] + -1;
      pNVar19 = pIVar7[iVar4].data.
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .m_elem;
      pNVar19[lVar14].idx = (int)lVar10;
      if (scale) {
        puVar1 = (undefined8 *)((long)pNVar18[-1].val.m_backend.data._M_elems + lVar16);
        local_178 = *puVar1;
        uStack_170 = puVar1[1];
        puVar1 = (undefined8 *)((long)pNVar18[-1].val.m_backend.data._M_elems + lVar16 + 0x10);
        local_168 = *puVar1;
        uStack_160 = puVar1[1];
        puVar1 = (undefined8 *)((long)pNVar18[-1].val.m_backend.data._M_elems + lVar16 + 0x20);
        local_158 = *puVar1;
        uStack_150 = puVar1[1];
        puVar1 = (undefined8 *)((long)pNVar18[-1].val.m_backend.data._M_elems + lVar16 + 0x30);
        local_148 = *puVar1;
        uStack_140 = puVar1[1];
        local_138 = *(undefined4 *)((long)(&pNVar18[-1].val.m_backend.data + 1) + lVar16);
        local_134 = *(undefined1 *)((long)(&pNVar18[-1].val.m_backend.data + 1) + lVar16 + 4);
        local_130 = *(undefined8 *)((long)(&pNVar18[-1].val.m_backend.data + 1) + lVar16 + 8);
        piVar11 = (this->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).scaleExp.data;
        spxLdexp<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
                  ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                    *)&empty,(soplex *)&local_178,
                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)(ulong)(piVar11[iVar15] + uVar9),(int)piVar11);
        pNVar18 = (pIVar17->data).
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .m_elem;
        puVar2 = (uint *)((long)pNVar18[-1].val.m_backend.data._M_elems + lVar16 + 0x30);
        *(undefined8 *)puVar2 = empty.left.m_backend.data._M_elems._48_8_;
        *(undefined8 *)(puVar2 + 2) = empty.left.m_backend.data._M_elems._56_8_;
        puVar2 = (uint *)((long)pNVar18[-1].val.m_backend.data._M_elems + lVar16 + 0x20);
        *(undefined8 *)puVar2 = empty.left.m_backend.data._M_elems._32_8_;
        *(undefined8 *)(puVar2 + 2) = empty.left.m_backend.data._M_elems._40_8_;
        puVar2 = (uint *)((long)pNVar18[-1].val.m_backend.data._M_elems + lVar16 + 0x10);
        *(undefined8 *)puVar2 = empty.left.m_backend.data._M_elems._16_8_;
        *(undefined8 *)(puVar2 + 2) = empty.left.m_backend.data._M_elems._24_8_;
        puVar1 = (undefined8 *)((long)pNVar18[-1].val.m_backend.data._M_elems + lVar16);
        *puVar1 = CONCAT44(empty.left.m_backend.data._M_elems[1],
                           empty.left.m_backend.data._M_elems[0]);
        puVar1[1] = CONCAT44(empty.left.m_backend.data._M_elems[3],
                             empty.left.m_backend.data._M_elems[2]);
        *(int *)((long)(&pNVar18[-1].val.m_backend.data + 1) + lVar16) = empty.left.m_backend.exp;
        *(bool *)((long)(&pNVar18[-1].val.m_backend.data + 1) + lVar16 + 4) =
             empty.left.m_backend.neg;
        *(undefined8 *)((long)(&pNVar18[-1].val.m_backend.data + 1) + lVar16 + 8) =
             empty.left.m_backend._72_8_;
        pNVar18 = (pIVar17->data).
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .m_elem;
        pNVar19 = pIVar7[iVar4].data.
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .m_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)(pNVar19 + lVar14),
                 (cpp_dec_float<100U,_int,_void> *)
                 ((long)pNVar18[-1].val.m_backend.data._M_elems + lVar16));
      uVar13 = (ulong)((int)uVar13 - 1);
      lVar16 = lVar16 + -0x54;
    }
  }
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x51])(this,(ulong)(uint)(iVar15 - iVar3));
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x50])
            (this,(ulong)(uint)((this->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .set.thenum - p_size));
  DataArray<int>::~DataArray(&newRows);
  return;
}

Assistant:

void doAddCols(const LPColSetBase<R>& set, bool scale = false)
   {
      int i, j;
      int oldColNumber = nCols();
      int oldRowNumber = nRows();
      DataArray < int > newRows(nRows());

      if(&set != this)
         LPColSetBase<R>::add(set);

      assert(LPColSetBase<R>::isConsistent());
      assert(LPRowSetBase<R>::isConsistent());

      // count additional nonzeros per row
      for(i = nRows() - 1; i >= 0; --i)
         newRows[i] = 0;

      for(i = set.num() - 1; i >= 0; --i)
      {
         const SVectorBase<R>& vec = set.colVector(i);

         for(j = vec.size() - 1; j >= 0; --j)
         {
            // create new rows if required
            int l = vec.index(j);

            if(l >= nRows())
            {
               LPRowBase<R> empty;
               newRows.reSize(l + 1);

               for(int k = nRows(); k <= l; ++k)
               {
                  newRows[k] = 0;
                  LPRowSetBase<R>::add(empty);
               }

            }

            assert(l < nRows());
            newRows[l]++;
         }
      }

      // extend rows as required
      for(i = 0; i < nRows(); ++i)
      {
         if(newRows[i] > 0)
         {
            int len = newRows[i] + rowVector(i).size();
            LPRowSetBase<R>::xtend(i, len);
            rowVector_w(i).set_size(len);
         }
      }

      // insert new elements to row file
      for(i = oldColNumber; i < nCols(); ++i)
      {
         // @todo: Is there a better way to write the following if, else?
         if(thesense == MAXIMIZE)
         {
            LPColSetBase<R>::maxObj_w(i) *= 1;
         }
         else                  // thesense is MINIMIZE = -1
         {
            LPColSetBase<R>::maxObj_w(i) *= -1;
         }

         SVectorBase<R>& vec = colVector_w(i);
         int newColScaleExp = 0;

         DataArray <int>& rowscaleExp = LPRowSetBase<R>::scaleExp;

         // compute new column scaling factor and apply it to the bounds
         if(scale)
         {
            newColScaleExp = lp_scaler->computeScaleExp(vec, rowscaleExp);

            if(upper(i) < R(infinity))
               upper_w(i) = spxLdexp(upper_w(i), - newColScaleExp);

            if(lower(i) > R(-infinity))
               lower_w(i) = spxLdexp(lower_w(i), - newColScaleExp);

            maxObj_w(i) = spxLdexp(maxObj_w(i), newColScaleExp);

            LPColSetBase<R>::scaleExp[i] = newColScaleExp;
         }

         for(j = vec.size() - 1; j >= 0; --j)
         {
            int k = vec.index(j);
            SVectorBase<R>& row = rowVector_w(k);
            int idx = row.size() - newRows[k];
            assert(newRows[k] > 0);
            newRows[k]--;
            row.index(idx) = i;

            // apply new column and existing row scaling factors to both ColSet and RowSet
            if(scale)
               vec.value(j) = spxLdexp(vec.value(j), newColScaleExp + rowscaleExp[k]);

            row.value(idx) = vec.value(j);
         }
      }

#ifndef NDEBUG

      for(i = 0; i < nRows(); ++i)
         assert(newRows[i] == 0);

#endif

      assert(SPxLPBase<R>::isConsistent());

      assert(set.num() == nCols() - oldColNumber);
      addedCols(nCols() - oldColNumber);
      addedRows(nRows() - oldRowNumber);
   }